

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImGui::ParseFormatTrimDecorations(char *fmt,char *buf,int buf_size)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  byte *__src;
  uint uVar5;
  byte *pbVar6;
  
  bVar1 = *fmt;
  __src = (byte *)fmt;
  while( true ) {
    if (bVar1 == 0) {
      return fmt;
    }
    if ((bVar1 == 0x25) && (__src[1] != 0x25)) break;
    __src = __src + (ulong)(bVar1 == 0x25) + 1;
    bVar1 = *__src;
  }
  uVar5 = 0x25;
  pbVar6 = __src;
  do {
    pbVar4 = pbVar6;
    pbVar6 = pbVar4 + 1;
    if (((byte)((char)uVar5 + 0x9fU) < 0x1a) &&
       ((pbVar2 = pbVar6, 0x12 < uVar5 - 0x68 || ((0x49015U >> (uVar5 - 0x68 & 0x1f) & 1) == 0))))
    goto LAB_0015bc80;
    bVar1 = *pbVar6;
    uVar5 = (uint)bVar1;
  } while ((bVar1 != 0) && (bVar1 == 0x4c || 0x19 < (byte)(bVar1 + 0xbf)));
  pbVar2 = pbVar4 + 2;
  pbVar4 = pbVar6;
LAB_0015bc80:
  pbVar6 = __src;
  if (*pbVar2 != 0) {
    iVar3 = ((int)pbVar4 - (int)__src) + 2;
    if (buf_size <= iVar3) {
      iVar3 = buf_size;
    }
    pbVar6 = (byte *)buf;
    if (iVar3 != 0) {
      strncpy(buf,(char *)__src,(long)iVar3);
      buf[(long)iVar3 - 1] = '\0';
    }
  }
  return (char *)pbVar6;
}

Assistant:

const char* ImGui::ParseFormatTrimDecorationsLeading(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}